

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::VariablePortHeaderSyntax::getChild(VariablePortHeaderSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  TokenOrSyntax *pTVar1;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    break;
  case 1:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    break;
  case 2:
    token_01.info = in_RSI;
    token_01._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_01);
    break;
  case 3:
    pTVar1 = in_RDI;
    not_null<slang::syntax::DataTypeSyntax_*>::get
              ((not_null<slang::syntax::DataTypeSyntax_*> *)&in_RSI[4].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff98);
    in_RDI = pTVar1;
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax VariablePortHeaderSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return constKeyword;
        case 1: return direction;
        case 2: return varKeyword;
        case 3: return dataType.get();
        default: return nullptr;
    }
}